

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLElementDecl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XMLElementDecl::serialize(XMLElementDecl *this,XSerializeEngine *serEng)

{
  QName *pQVar1;
  size_t in_RCX;
  void *in_RDX;
  int i;
  CreateReasons local_1c;
  
  if (serEng->fStoreLoad != 0) {
    pQVar1 = (QName *)XSerializeEngine::read(serEng,0x418090,in_RDX,in_RCX);
    this->fElementName = pQVar1;
    XSerializeEngine::operator>>(serEng,(int *)&local_1c);
    this->fCreateReason = local_1c;
    XSerializeEngine::readSize(serEng,&this->fId);
    XSerializeEngine::operator>>(serEng,&this->fExternalElement);
    return;
  }
  XSerializeEngine::write(serEng,(int)this->fElementName,in_RDX,in_RCX);
  XSerializeEngine::operator<<(serEng,this->fCreateReason);
  XSerializeEngine::writeSize(serEng,this->fId);
  XSerializeEngine::operator<<(serEng,this->fExternalElement);
  return;
}

Assistant:

void XMLElementDecl::serialize(XSerializeEngine& serEng)
{

    if (serEng.isStoring())
    {
        serEng<<fElementName;
        serEng<<(int) fCreateReason;
        serEng.writeSize (fId);
        serEng<<fExternalElement;
    }
    else
    {
        serEng>>fElementName;

        int i;
        serEng>>i;
        fCreateReason=(CreateReasons)i;

        serEng.readSize (fId);
        serEng>>fExternalElement;
    }

}